

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

void Amap_LibPrintSelectedGates(Amap_Lib_t *p,int fAllGates)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *local_38;
  uint local_2c;
  int i;
  Amap_Gat_t *pGate;
  Vec_Ptr_t *vArray;
  int fAllGates_local;
  Amap_Lib_t *p_local;
  
  if (fAllGates == 0) {
    local_38 = p->vSelect;
  }
  else {
    local_38 = p->vGates;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(local_38), (int)local_2c < iVar1; local_2c = local_2c + 1)
  {
    pvVar2 = Vec_PtrEntry(local_38,local_2c);
    printf("%3d :%12s %d %9.2f  ",*(undefined8 *)((long)pvVar2 + 0x20),(ulong)local_2c,
           *(undefined8 *)((long)pvVar2 + 0x10),(ulong)(*(uint *)((long)pvVar2 + 0x38) >> 0x18));
    printf("%4s=%40s  ",*(undefined8 *)((long)pvVar2 + 0x18),*(undefined8 *)((long)pvVar2 + 0x28));
    printf("DSD: ");
    Kit_DsdPrintFromTruth(*(uint **)((long)pvVar2 + 0x30),*(uint *)((long)pvVar2 + 0x38) >> 0x18);
    printf("\n");
  }
  return;
}

Assistant:

void Amap_LibPrintSelectedGates( Amap_Lib_t * p, int fAllGates )
{
    Vec_Ptr_t * vArray;
    Amap_Gat_t * pGate;
    int i;
    vArray = fAllGates? p->vGates : p->vSelect;
    Vec_PtrForEachEntry( Amap_Gat_t *, vArray, pGate, i )
    {
        printf( "%3d :%12s %d %9.2f  ", i, pGate->pName, pGate->nPins, pGate->dArea );
        printf( "%4s=%40s  ", pGate->pOutName, pGate->pForm );
        printf( "DSD: " );
        Kit_DsdPrintFromTruth( pGate->pFunc, pGate->nPins );
        printf( "\n" );
    }
}